

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

SquareMatrix<double> __thiscall
qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
          (QCircuit<double,_qclab::QObject<double>_> *this)

{
  bool bVar1;
  reference this_00;
  pointer pQVar2;
  data_type extraout_RDX;
  QCircuit<double,_qclab::QObject<double>_> *in_RSI;
  SquareMatrix<double> SVar3;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
  local_40 [3];
  __normal_iterator<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
  local_28;
  const_iterator it;
  QCircuit<double,_qclab::QObject<double>_> *this_local;
  SquareMatrix<double> *mat;
  
  it._M_current._7_1_ = 0;
  dense::eye<double>((dense *)this,(long)(1 << ((byte)in_RSI->nbQubits_ & 0x1f)));
  local_28._M_current =
       (unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_> *)
       begin(in_RSI);
  while( true ) {
    local_40[0]._M_current =
         (unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_> *)
         end(in_RSI);
    bVar1 = __gnu_cxx::
            operator==<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
                      (&local_28,local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
              ::operator*(&local_28);
    pQVar2 = std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>
             ::operator->(this_00);
    (*pQVar2->_vptr_QObject[9])(pQVar2,0x52,0x4e,(ulong)(uint)in_RSI->nbQubits_,this,0);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
    ::operator++(&local_28);
  }
  SVar3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
        auto mat = qclab::dense::eye< T >( 1 << nbQubits_ ) ;
        for ( auto it = begin(); it != end(); ++it ) {
          (*it)->apply( Side::Right , Op::NoTrans , nbQubits_ , mat ) ;
        }
        return mat ;
      }